

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trivialre_test.cc
# Opt level: O1

bool CompilationFails(string_view str)

{
  undefined1 uVar1;
  StringTestingBuilder *pSVar2;
  long *local_b0 [2];
  long local_a0 [2];
  undefined1 local_90 [8];
  C<StringTestingBuilder,_Policy> compiler;
  long local_78;
  long local_70 [2];
  char local_60;
  long local_58;
  undefined4 *local_48;
  long local_40;
  undefined4 local_38;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined2 uStack_32;
  
  local_90[0] = 0;
  compiler._0_8_ = &compiler.builder;
  trivialre::re_compiler::
  C<StringTestingBuilder,CompilationFails(std::basic_string_view<char,std::char_traits<char>>)::Policy>
  ::ParseAlt_abi_cxx11_((ParseResult *)&compiler.builder,local_90,str);
  if (local_58 != 0) {
    local_90[0] = 1;
  }
  local_48 = &local_38;
  if (local_60 == '\0') {
    uStack_34 = 0x3e;
    local_38 = 0x796e613c;
    local_40 = 5;
    uStack_33 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,compiler.builder,compiler.builder + local_78);
  }
  if (local_60 == '\x01') {
    local_60 = '\0';
    if (compiler.builder != (StringTestingBuilder *)local_70) {
      operator_delete(compiler.builder,local_70[0] + 1);
    }
  }
  compiler.builder = (StringTestingBuilder *)local_70;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&compiler.builder,str._M_str,str._M_str + str._M_len);
  pSVar2 = compiler.builder;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char*>((string *)local_b0,local_48,local_40 + (long)local_48);
  printf("for failing: %s -> %s\n",pSVar2,local_b0[0]);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  if (compiler.builder != (StringTestingBuilder *)local_70) {
    operator_delete(compiler.builder,local_70[0] + 1);
  }
  uVar1 = local_90[0];
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT26(uStack_32,CONCAT15(uStack_33,CONCAT14(uStack_34,local_38))) +
                             1);
  }
  return (bool)uVar1;
}

Assistant:

bool CompilationFails(std::string_view str) {
  struct Policy {
    bool failed{};
    void NoteError(std::string_view msg, std::string_view at) { failed = true; }
    void StartedParsing(std::string_view str) {}
  };
  trivialre::re_compiler::C<StringTestingBuilder, Policy> compiler({});
  std::string result = compiler.CompileOrDie(str);
  printf("for failing: %s -> %s\n", std::string(str).c_str(), std::string(result).c_str());
  return compiler.failed;
}